

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O0

bool __thiscall
GdlRenderer::CheckTablesAndPasses(GdlRenderer *this,GrcManager *pcman,int *pcpassValid)

{
  bool bVar1;
  GdlRuleTable *staMsg;
  GdlRuleTable *staMsg_00;
  GdlRuleTable *sta3;
  GdlRuleTable *pGVar2;
  int *in_RDX;
  GdlRenderer *in_RDI;
  int *in_stack_00000108;
  int *in_stack_00000110;
  GrcManager *in_stack_00000118;
  GdlRuleTable *in_stack_00000120;
  GdlRuleTable *prultbl;
  int nPassNum;
  allocator *sta2;
  allocator *pgdlobj;
  int iVar3;
  GdlRenderer *this_00;
  GrcErrorList *in_stack_fffffffffffffe70;
  string local_188 [32];
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  undefined1 local_49 [33];
  GdlRuleTable *local_28;
  int local_1c;
  int *local_18;
  
  local_1c = 0;
  in_RDI->m_ipassBidi = -1;
  this_00 = (GdlRenderer *)local_49;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_49 + 1),"linebreak",(allocator *)this_00);
  staMsg = FindRuleTable(this_00,(string *)in_RDI);
  local_28 = staMsg;
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  if (staMsg != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses
              (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  }
  pgdlobj = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"substitution",pgdlobj);
  staMsg_00 = FindRuleTable(this_00,(string *)in_RDI);
  local_28 = staMsg_00;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  if (staMsg_00 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses
              (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  }
  sta2 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"justification",sta2);
  sta3 = FindRuleTable(this_00,(string *)in_RDI);
  local_28 = sta3;
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if (sta3 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses
              (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"positioning",&local_d1);
  pGVar2 = FindRuleTable(this_00,(string *)in_RDI);
  iVar3 = (int)((ulong)this_00 >> 0x20);
  local_28 = pGVar2;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  if (pGVar2 != (GdlRuleTable *)0x0) {
    GdlRuleTable::CheckTablesAndPasses
              (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  }
  *local_18 = local_1c;
  bVar1 = Bidi(in_RDI);
  if ((bVar1) && (in_RDI->m_ipassBidi == -1)) {
    in_RDI->m_ipassBidi = local_1c;
  }
  if (local_1c < 0x80) {
    if (local_1c == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_188,"No valid passes",(allocator *)&stack0xfffffffffffffe77);
      GrcErrorList::AddWarning
                (in_stack_fffffffffffffe70,iVar3,&in_RDI->super_GdlObject,(string *)staMsg);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe77);
    }
  }
  else {
    std::allocator<char>::allocator();
    iVar3 = (int)((ulong)staMsg >> 0x20);
    std::__cxx11::string::string(local_f8,"Number of passes (",&local_f9);
    std::__cxx11::to_string(iVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,") exceeds maximum of ",&local_141);
    std::__cxx11::to_string(iVar3);
    GrcErrorList::AddError
              ((GrcErrorList *)in_RDI,iVar3,(GdlObject *)pgdlobj,(string *)staMsg_00,(string *)sta2,
               (string *)sta3,(string *)in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  return true;
}

Assistant:

bool GdlRenderer::CheckTablesAndPasses(GrcManager * pcman, int * pcpassValid)
{
	int nPassNum = 0;

	GdlRuleTable * prultbl;

	m_ipassBidi = -1;

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	//if (Bidi())
	//	m_ipassBidi = nPassNum;
	//else
	//	m_ipassBidi = -1;

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->CheckTablesAndPasses(pcman, &nPassNum, &m_ipassBidi);

	//	At this point nPassNum = the number of valid passes.
	*pcpassValid = nPassNum;

	if (this->Bidi() && m_ipassBidi == -1)
		m_ipassBidi = nPassNum;

	if (nPassNum >= kMaxPasses)
	{
		g_errorList.AddError(3101, NULL,
			"Number of passes (",
			std::to_string(nPassNum),
			") exceeds maximum of ",
			std::to_string(kMaxPasses - 1));
	}
	else if (nPassNum == 0)
	{
		g_errorList.AddWarning(3502, NULL,
			"No valid passes");
	}

	return true;
}